

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

EVmaster INT_EVmaster_create(CManager_conflict cm)

{
  int iVar1;
  __pid_t _Var2;
  EVmaster __s;
  pthread_t pVar3;
  attr_list p_Var4;
  char *pcVar5;
  CManager_conflict in_RDI;
  CMTraceType in_stack_0000000c;
  timespec ts;
  attr_list contact_list;
  EVmaster master;
  CManager_conflict in_stack_ffffffffffffffc8;
  CManager_conflict in_stack_ffffffffffffffd0;
  CManager in_stack_ffffffffffffffd8;
  CManager_conflict in_stack_ffffffffffffffe0;
  
  __s = (EVmaster)INT_CMmalloc((size_t)in_stack_ffffffffffffffd0);
  memset(__s,0,0x60);
  __s->cm = in_RDI;
  __s->reconfig = 0;
  __s->sig_reconfig_bool = 0;
  __s->old_node_count = 1;
  __s->no_deployment = 0;
  __s->state = DFG_Joining;
  iVar1 = CMtrace_val[0xd];
  if (in_RDI->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init((CManager)ts.tv_sec,in_stack_0000000c);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffffc8 = (CManager_conflict)in_RDI->CMTrace_file;
      _Var2 = getpid();
      in_stack_ffffffffffffffd0 = (CManager_conflict)(long)_Var2;
      pVar3 = pthread_self();
      fprintf((FILE *)in_stack_ffffffffffffffc8,"P%lxT%lx - ",in_stack_ffffffffffffffd0,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&stack0xffffffffffffffd8);
      fprintf((FILE *)in_RDI->CMTrace_file,"%lld.%.9ld - ",in_stack_ffffffffffffffd8,
              in_stack_ffffffffffffffe0);
    }
    fprintf((FILE *)in_RDI->CMTrace_file,"EVDFG initialization -  master DFG state set to %s\n",
            str_state[__s->state]);
  }
  fflush((FILE *)in_RDI->CMTrace_file);
  p_Var4 = INT_CMget_contact_list(in_stack_ffffffffffffffc8);
  pcVar5 = (char *)attr_list_to_string(p_Var4);
  __s->my_contact_str = pcVar5;
  free_attr_list(p_Var4);
  INT_CMregister_format(in_stack_ffffffffffffffd8,(FMStructDescList)in_stack_ffffffffffffffd0);
  INT_CMregister_format(in_stack_ffffffffffffffd8,(FMStructDescList)in_stack_ffffffffffffffd0);
  INT_CMregister_format(in_stack_ffffffffffffffd8,(FMStructDescList)in_stack_ffffffffffffffd0);
  INT_CMregister_format(in_stack_ffffffffffffffd8,(FMStructDescList)in_stack_ffffffffffffffd0);
  INT_CMregister_handler
            ((CMFormat)in_stack_ffffffffffffffe0,(CMHandlerFunc)in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  INT_CMregister_format(in_stack_ffffffffffffffd8,(FMStructDescList)in_stack_ffffffffffffffd0);
  INT_CMregister_handler
            ((CMFormat)in_stack_ffffffffffffffe0,(CMHandlerFunc)in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  INT_CMregister_format(in_stack_ffffffffffffffd8,(FMStructDescList)in_stack_ffffffffffffffd0);
  INT_CMregister_handler
            ((CMFormat)in_stack_ffffffffffffffe0,(CMHandlerFunc)in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  INT_CMregister_format(in_stack_ffffffffffffffd8,(FMStructDescList)in_stack_ffffffffffffffd0);
  INT_CMregister_handler
            ((CMFormat)in_stack_ffffffffffffffe0,(CMHandlerFunc)in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  INT_CMregister_format(in_stack_ffffffffffffffd8,(FMStructDescList)in_stack_ffffffffffffffd0);
  INT_CMregister_handler
            ((CMFormat)in_stack_ffffffffffffffe0,(CMHandlerFunc)in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  INT_CMadd_poll(in_stack_ffffffffffffffd0,(CMPollFunc)in_stack_ffffffffffffffc8,(void *)0x15d112);
  INT_CMadd_shutdown_task
            (in_stack_ffffffffffffffe0,(CMPollFunc)in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  return __s;
}

Assistant:

extern EVmaster
INT_EVmaster_create(CManager cm)
{
    EVmaster master = malloc(sizeof(struct _EVmaster));
    attr_list contact_list;

    memset(master, 0, sizeof(struct _EVmaster));
    master->cm = cm;
    master->reconfig = 0;
    master->sig_reconfig_bool = 0;
    master->old_node_count = 1;
    master->no_deployment = 0;
    master->state = DFG_Joining;

    CMtrace_out(cm, EVdfgVerbose, "EVDFG initialization -  master DFG state set to %s\n", str_state[master->state]);
    contact_list = INT_CMget_contact_list(cm);
    master->my_contact_str = attr_list_to_string(contact_list);
    free_attr_list(contact_list);

    /*
     * EVdfg master-sent messages
     */
    INT_CMregister_format(cm, EVdfg_ready_format_list);
    INT_CMregister_format(cm, EVdfg_deploy_format_list);
    INT_CMregister_format(cm, EVclient_shutdown_format_list);

    /*
     * EVdfg master-handled messages
     */
    INT_CMregister_handler(INT_CMregister_format(cm, EVdfg_node_join_format_list),
			   dfg_master_msg_handler, (void*)(((uintptr_t)master)|DFGnode_join));
    INT_CMregister_handler(INT_CMregister_format(cm, EVdfg_deploy_ack_format_list),
			   dfg_master_msg_handler, (void*)(((uintptr_t)master)|DFGdeploy_ack));
    INT_CMregister_handler(INT_CMregister_format(cm, EVclient_shutdown_contribution_format_list),
			   dfg_master_msg_handler, (void*)(((uintptr_t)master)|DFGshutdown_contrib));
    INT_CMregister_handler(INT_CMregister_format(cm, EVdfg_conn_shutdown_format_list),
			   dfg_master_msg_handler, (void*)(((uintptr_t)master)|DFGconn_shutdown));
    INT_CMregister_handler(INT_CMregister_format(cm, EVdfg_flush_attrs_reconfig_format_list),
			   dfg_master_msg_handler, (void*)(((uintptr_t)master)|DFGflush_reconfig));

    INT_CMadd_poll(cm, handle_queued_messages_lock, master);
    INT_CMadd_shutdown_task(cm, free_master, master, FREE_TASK);
    return master;
}